

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O0

void char_update(void)

{
  short sVar1;
  CHAR_DATA *pCVar2;
  ulong uVar3;
  AFFECT_DATA *pAVar4;
  string_view fmt;
  bool bVar5;
  bool bVar6;
  int iVar7;
  double *pdVar8;
  int *piVar9;
  CClass *pCVar10;
  __type_conflict2 _Var11;
  bool in_stack_00000072;
  bool in_stack_00000073;
  int in_stack_00000074;
  int in_stack_00000078;
  int in_stack_0000007c;
  CHAR_DATA *in_stack_00000080;
  CHAR_DATA *in_stack_00000088;
  OBJ_DATA *obj;
  int in_stack_000000a8;
  char buf1 [4608];
  bool charm_gone;
  AFFECT_DATA *paf_next;
  AFFECT_DATA *paf;
  CHAR_DATA *master;
  bool ghost;
  int hgain;
  CHAR_DATA *ch_quit;
  CHAR_DATA *ch_next;
  CHAR_DATA *ch;
  CHAR_DATA *in_stack_00003588;
  undefined4 in_stack_ffffffffffffecf8;
  int in_stack_ffffffffffffecfc;
  int in_stack_ffffffffffffed00;
  int in_stack_ffffffffffffed04;
  undefined4 in_stack_ffffffffffffed08;
  undefined4 in_stack_ffffffffffffed0c;
  char *in_stack_ffffffffffffed10;
  CHAR_DATA *in_stack_ffffffffffffed18;
  CHAR_DATA *in_stack_ffffffffffffed20;
  CHAR_DATA *in_stack_ffffffffffffed30;
  CHAR_DATA *in_stack_ffffffffffffed38;
  CHAR_DATA *in_stack_ffffffffffffed40;
  CHAR_DATA *in_stack_ffffffffffffed48;
  ulong in_stack_ffffffffffffed50;
  int in_stack_ffffffffffffed58;
  int in_stack_ffffffffffffed5c;
  ulong in_stack_ffffffffffffed78;
  int in_stack_ffffffffffffed80;
  int in_stack_ffffffffffffed84;
  int local_1278 [2];
  OBJ_DATA *local_1270;
  double local_1268;
  double local_1260;
  char local_1258 [44];
  int in_stack_ffffffffffffedd4;
  undefined1 in_stack_ffffffffffffeddb;
  int in_stack_ffffffffffffeddc;
  CHAR_DATA *in_stack_ffffffffffffede0;
  int in_stack_ffffffffffffedfc;
  CHAR_DATA *in_stack_ffffffffffffee00;
  undefined1 in_stack_ffffffffffffee6f;
  char *in_stack_ffffffffffffee70;
  CHAR_DATA *in_stack_ffffffffffffee78;
  undefined1 in_stack_ffffffffffffffb7;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  AFFECT_DATA *local_30;
  CHAR_DATA *local_8;
  
  bVar5 = false;
  save_number = save_number + 1;
  if (2 < save_number) {
    save_number = 0;
  }
  local_8 = char_list;
  pCVar2 = local_8;
  do {
    while( true ) {
      local_8 = pCVar2;
      if (local_8 == (char_data *)0x0) {
        local_8 = char_list;
        pCVar2 = local_8;
        while (local_8 = pCVar2, local_8 != (CHAR_DATA *)0x0) {
          pCVar2 = local_8->next;
          if ((local_8->desc != (DESCRIPTOR_DATA *)0x0) &&
             ((int)local_8->desc->descriptor % 3 == save_number)) {
            save_char_obj(in_stack_00003588);
          }
        }
        return;
      }
      pCVar2 = local_8->next;
      bVar6 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
      if (((!bVar6) || (((sun != 1 && (sun != 2)) || (local_8->in_room == (ROOM_INDEX_DATA *)0x0))))
         || (((iVar7 = number_percent(), 0x59 < iVar7 ||
              (bVar6 = is_affected_by((CHAR_DATA *)
                                      CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                                      in_stack_ffffffffffffed04), bVar6)) ||
             (local_8->fighting != (CHAR_DATA *)0x0)))) {
        bVar6 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
        if (((bVar6) && (2 < sun)) &&
           ((local_8->in_room != (ROOM_INDEX_DATA *)0x0 &&
            ((iVar7 = number_percent(), iVar7 < 0x5a && (local_8->fighting == (CHAR_DATA *)0x0))))))
        {
          uVar3 = local_8->act[0];
          _Var11 = std::pow<int,int>(0,0x639943);
          if (((uVar3 & (long)_Var11) == 0) ||
             (bVar6 = is_affected_by((CHAR_DATA *)
                                     CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                                     in_stack_ffffffffffffed04), !bVar6)) {
            uVar3 = local_8->act[1];
            _Var11 = std::pow<int,int>(0,0x6399be);
            if (((uVar3 & (long)_Var11) != 0) &&
               (bVar6 = is_affected_by((CHAR_DATA *)
                                       CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08)
                                       ,in_stack_ffffffffffffed04), !bVar6)) {
              _Var11 = std::pow<int,int>(0,0x6399f6);
              local_8->affected_by[0] = (long)_Var11 | local_8->affected_by[0];
            }
          }
          else {
            _Var11 = std::pow<int,int>(0,0x63997d);
            local_8->affected_by[0] = ((long)_Var11 ^ 0xffffffffffffffffU) & local_8->affected_by[0]
            ;
          }
        }
      }
      else {
        in_stack_ffffffffffffed78 = local_8->act[1];
        _Var11 = std::pow<int,int>(0,0x6397e5);
        if (((in_stack_ffffffffffffed78 & (long)_Var11) == 0) ||
           (bVar6 = is_affected_by((CHAR_DATA *)
                                   CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                                   in_stack_ffffffffffffed04), !bVar6)) {
          uVar3 = local_8->act[0];
          _Var11 = std::pow<int,int>(0,0x639866);
          if (((uVar3 & (long)_Var11) != 0) &&
             (bVar6 = is_affected_by((CHAR_DATA *)
                                     CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                                     in_stack_ffffffffffffed04), !bVar6)) {
            _Var11 = std::pow<int,int>(0,0x63989e);
            local_8->affected_by[0] = (long)_Var11 | local_8->affected_by[0];
          }
        }
        else {
          _Var11 = std::pow<int,int>(0,0x639822);
          local_8->affected_by[0] = ((long)_Var11 ^ 0xffffffffffffffffU) & local_8->affected_by[0];
        }
      }
      if (0 < local_8->pause) {
        local_8->pause = local_8->pause + -1;
      }
      bVar6 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
      if (((bVar6) && (local_8->hit < 0)) && (local_8->in_room != (ROOM_INDEX_DATA *)0x0)) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffed10,
                   (char *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
        fmt._M_str._0_4_ = in_stack_ffffffffffffed58;
        fmt._M_len = in_stack_ffffffffffffed50;
        fmt._M_str._4_4_ = in_stack_ffffffffffffed5c;
        CLogger::Warn<char*&,short&,int&>
                  ((CLogger *)in_stack_ffffffffffffed48,fmt,(char **)in_stack_ffffffffffffed40,
                   (short *)in_stack_ffffffffffffed38,(int *)in_stack_ffffffffffffed30);
      }
      if (0 < local_8->ghost) {
        local_8->ghost = local_8->ghost + -1;
        in_stack_ffffffffffffed5c = (int)local_8->ghost;
        if (local_8->ghost == 0) {
          send_to_char(in_stack_ffffffffffffed10,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
        }
        else if (in_stack_ffffffffffffed5c == 2) {
          send_to_char(in_stack_ffffffffffffed10,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
        }
        else if (in_stack_ffffffffffffed5c == 4) {
          send_to_char(in_stack_ffffffffffffed10,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
        }
      }
      if (0 < local_8->bounty_timer) {
        local_8->bounty_timer = local_8->bounty_timer + -1;
      }
      if (0 < local_8->ghost) {
        bVar5 = true;
      }
      bVar6 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
      if (((!bVar6) && (local_8->level < 0x14)) &&
         ((0x6017 < local_8->in_room->vnum || (local_8->in_room->vnum < 0x5fb4)))) {
        while (local_8->level < 0x14) {
          local_8->level = local_8->level + 1;
          advance_level(in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
        }
        iVar7 = exp_per_level((CHAR_DATA *)
                              CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
        local_8->exp = iVar7 * (local_8->level + -1);
        colorconv((char *)in_stack_ffffffffffffed20,(char *)in_stack_ffffffffffffed18,
                  (CHAR_DATA *)in_stack_ffffffffffffed10);
        send_to_char(in_stack_ffffffffffffed10,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
        colorconv((char *)in_stack_ffffffffffffed20,(char *)in_stack_ffffffffffffed18,
                  (CHAR_DATA *)in_stack_ffffffffffffed10);
        send_to_char(in_stack_ffffffffffffed10,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
        if (local_8->pet != (CHAR_DATA *)0x0) {
          sprintf(local_1258,
                  "Remember, you can ask your familiar questions.  For example, \'say %s, how do I get to my guild?\'.\n\r"
                  ,local_8->pet->short_descr);
          send_to_char(in_stack_ffffffffffffed10,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
        }
      }
      bVar6 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
      if (!bVar6) {
        char_data::Profs(local_8);
        CProficiencies::UpdateProfPoints
                  ((CProficiencies *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
      }
      bVar6 = is_affected_by((CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                             in_stack_ffffffffffffed04);
      if (((!bVar6) && (bVar6 = is_affected(local_8,(int)gsn_bleeding), bVar6)) &&
         (local_8->position == 4)) {
        local_8->position = 8;
      }
      if (2 < local_8->position) {
        if (local_8->hit < (int)local_8->max_hit) {
          iVar7 = hit_gain(in_stack_ffffffffffffed38);
          local_8->hit = iVar7 + local_8->hit;
        }
        else {
          local_8->hit = (int)local_8->max_hit;
        }
        if (local_8->mana < local_8->max_mana) {
          iVar7 = mana_gain(in_stack_ffffffffffffed18);
          local_8->mana = local_8->mana + (short)iVar7;
        }
        else {
          local_8->mana = local_8->max_mana;
        }
        if (local_8->move < local_8->max_move) {
          bVar6 = is_affected(local_8,(int)gsn_repose);
          if (bVar6) {
            in_stack_ffffffffffffed58 =
                 move_gain((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
            in_stack_ffffffffffffed58 = in_stack_ffffffffffffed58 << 1;
          }
          else {
            in_stack_ffffffffffffed58 =
                 move_gain((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
          }
          local_8->move = local_8->move + (short)in_stack_ffffffffffffed58;
        }
        else {
          local_8->move = local_8->max_move;
        }
      }
      if (local_8->position == 3) {
        update_pos((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00));
      }
      if (local_8->position < 3) {
        in_stack_ffffffffffffecf8 = 0;
        in_stack_ffffffffffffed00 = 0;
        in_stack_ffffffffffffed08 = 1;
        in_stack_ffffffffffffed10 = "slow bleeding";
        damage_new(in_stack_00000088,in_stack_00000080,in_stack_0000007c,in_stack_00000078,
                   in_stack_00000074,in_stack_00000073,in_stack_00000072,in_stack_000000a8,
                   buf1._0_4_,(char *)buf1._8_8_);
      }
      local_1260 = 0.0;
      local_1268 = (double)local_8->talismanic - 0.0625;
      pdVar8 = std::max<double>(&local_1260,&local_1268);
      local_8->talismanic = (float)*pdVar8;
      bVar6 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
      if ((!bVar6) && (local_8->in_room != (ROOM_INDEX_DATA *)0x0)) {
        local_8->pcdata->sect_time[0] = local_8->pcdata->sect_time[0] + 1;
        sVar1 = local_8->in_room->sector_type;
        local_8->pcdata->sect_time[sVar1] = local_8->pcdata->sect_time[sVar1] + 1;
      }
      bVar6 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
      if ((!bVar6) && (local_8->pcdata->save_timer != 0)) {
        local_8->pcdata->save_timer = local_8->pcdata->save_timer + -1;
      }
      bVar6 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
      if (!bVar6) break;
LAB_0063a487:
      bVar6 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
      if ((bVar6) || (local_8->desc != (DESCRIPTOR_DATA *)0x0)) {
        pAVar4 = local_8->affected;
LAB_0063a4c6:
        while( true ) {
          local_30 = pAVar4;
          if ((local_30 == (AFFECT_DATA *)0x0) ||
             ((pAVar4 = local_30->next, !bVar5 && (0 < local_8->ghost)))) goto LAB_0063ab19;
          if (local_30->duration < 1) break;
          if (local_30->tick_fun != (AFF_FUN *)0x0) {
            (*local_30->tick_fun)(local_8,local_30);
          }
          if ((local_8 == (char_data *)0x0) || ((!bVar5 && (0 < local_8->ghost))))
          goto LAB_0063ab19;
          if (local_30 != (AFFECT_DATA *)0x0) {
            local_30->duration = local_30->duration + -1;
            iVar7 = number_range(in_stack_ffffffffffffed00,in_stack_ffffffffffffecfc);
            if ((iVar7 == 0) && (0 < local_30->level)) {
              local_30->level = local_30->level + -1;
            }
          }
        }
        if (-1 < local_30->duration) {
          if ((local_30->type == gsn_entwine) &&
             ((local_30->owner == (CHAR_DATA *)0x0 ||
              ((local_30->owner != (CHAR_DATA *)0x0 &&
               (local_8->in_room != local_30->owner->in_room)))))) {
            affect_remove(in_stack_ffffffffffffed40,(AFFECT_DATA *)in_stack_ffffffffffffed38);
          }
          else {
            if (local_30->owner == (CHAR_DATA *)0x0) {
LAB_0063a6ef:
              if (local_30->owner == (CHAR_DATA *)0x0) {
                pCVar10 = char_data::Class((char_data *)in_stack_ffffffffffffed10);
                iVar7 = CClass::GetIndex(pCVar10);
                if (iVar7 == 4) {
                  in_stack_ffffffffffffed40 = local_8;
                  if (local_30->owner != (CHAR_DATA *)0x0) {
                    in_stack_ffffffffffffed40 = local_30->owner;
                  }
                  in_stack_ffffffffffffed48 = local_8;
                  bVar6 = trusts((CHAR_DATA *)
                                 CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                                 (CHAR_DATA *)
                                 CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00));
                  if (bVar6) goto LAB_0063a774;
                }
              }
            }
            else {
              pCVar10 = char_data::Class((char_data *)in_stack_ffffffffffffed10);
              iVar7 = CClass::GetIndex(pCVar10);
              if (iVar7 != 4) goto LAB_0063a6ef;
LAB_0063a774:
              if (local_30->aftype == 4) {
                iVar7 = number_percent();
                in_stack_ffffffffffffed38 = (CHAR_DATA *)(double)iVar7;
                in_stack_ffffffffffffed30 = local_8;
                if (local_30->owner != (CHAR_DATA *)0x0) {
                  in_stack_ffffffffffffed30 = local_30->owner;
                }
                iVar7 = get_skill(in_stack_ffffffffffffee00,in_stack_ffffffffffffedfc);
                if (((double)in_stack_ffffffffffffed38 < (double)iVar7 * 0.85) &&
                   ((skill_table[local_30->type].dispel & 4U) == 0)) {
                  check_improve(in_stack_ffffffffffffede0,in_stack_ffffffffffffeddc,
                                (bool)in_stack_ffffffffffffeddb,in_stack_ffffffffffffedd4);
                  if ((local_30->owner == (CHAR_DATA *)0x0) || (local_8 == local_30->owner)) {
                    act(in_stack_ffffffffffffed10,
                        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                        (void *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
                        (void *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),0);
                  }
                  else {
                    act(in_stack_ffffffffffffed10,
                        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                        (void *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
                        (void *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),0);
                  }
                  local_30->duration = local_30->init_duration;
                  in_stack_ffffffffffffed84 =
                       (int)local_8->mana - (int)skill_table[local_30->type].min_mana;
                  in_stack_ffffffffffffed80 = 0;
                  piVar9 = std::max<int>((int *)&stack0xffffffffffffed84,
                                         (int *)&stack0xffffffffffffed80);
                  local_8->mana = (short)*piVar9;
                  goto LAB_0063a4c6;
                }
              }
            }
            if (((pAVar4 == (AFFECT_DATA *)0x0) || (pAVar4->type != local_30->type)) ||
               (0 < pAVar4->duration)) {
              if ((0 < local_30->type) &&
                 (bVar6 = str_cmp(skill_table[local_30->type].msg_off,""), bVar6)) {
                send_to_char(in_stack_ffffffffffffed10,
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
                send_to_char(in_stack_ffffffffffffed10,
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
              }
              if (((local_30->type != 0) &&
                  (bVar6 = str_cmp(skill_table[local_30->type].room_msg_off,""), bVar6)) &&
                 (bVar6 = is_awake(local_8), bVar6)) {
                act(in_stack_ffffffffffffed10,
                    (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                    (void *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
                    (void *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),0);
              }
            }
            affect_remove(in_stack_ffffffffffffed40,(AFFECT_DATA *)in_stack_ffffffffffffed38);
          }
          goto LAB_0063a4c6;
        }
        if (local_30->tick_fun != (AFF_FUN *)0x0) {
          (*local_30->tick_fun)(local_8,local_30);
        }
        if ((bVar5) || (local_8->ghost < 1)) goto LAB_0063a4c6;
      }
LAB_0063ab19:
      if ((local_8 != (char_data *)0x0) &&
         ((((bVar5 || (local_8->ghost < 1)) &&
           (bVar6 = is_npc((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8)), !bVar6))
          && ((local_8->in_room != (ROOM_INDEX_DATA *)0x0 && (local_8->in_room->sector_type == 0xd))
             )))) {
        in_stack_ffffffffffffed20 = local_8;
        dice(in_stack_ffffffffffffed00,in_stack_ffffffffffffecfc);
        in_stack_ffffffffffffecf8 = 0;
        in_stack_ffffffffffffed00 = 0;
        in_stack_ffffffffffffed08 = 1;
        in_stack_ffffffffffffed10 = "the searing heat*";
        damage_new(in_stack_00000088,in_stack_00000080,in_stack_0000007c,in_stack_00000078,
                   in_stack_00000074,in_stack_00000073,in_stack_00000072,in_stack_000000a8,
                   buf1._0_4_,(char *)buf1._8_8_);
        in_stack_ffffffffffffed18 = local_8;
      }
    }
    local_1270 = get_eq_char(local_8,0);
    if (((local_1270 != (OBJ_DATA *)0x0) && (local_1270->item_type == 1)) &&
       (0 < local_1270->value[2])) {
      iVar7 = local_1270->value[2] + -1;
      local_1270->value[2] = iVar7;
      if ((iVar7 == 0) && (local_8->in_room != (ROOM_INDEX_DATA *)0x0)) {
        local_1278[1] = 0;
        local_1278[0] = local_8->in_room->light + -3;
        piVar9 = std::max<int>(local_1278 + 1,local_1278);
        local_8->in_room->light = (short)*piVar9;
        act(in_stack_ffffffffffffed10,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
            (void *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
            (void *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),0);
        act(in_stack_ffffffffffffed10,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
            (void *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
            (void *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),0);
        extract_obj((OBJ_DATA *)in_stack_ffffffffffffed20);
      }
      else if ((local_1270->value[2] < 6) && (local_8->in_room != (ROOM_INDEX_DATA *)0x0)) {
        act(in_stack_ffffffffffffed10,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
            (void *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
            (void *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),0);
      }
    }
    local_8->timer = local_8->timer + 1;
    if (((local_8->timer < 0x19) ||
        (bVar6 = is_heroimm((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8)), bVar6))
       || (bVar6 = is_immortal((CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8)), bVar6
          )) {
LAB_0063a445:
      gain_condition((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                     (int)(in_stack_ffffffffffffed78 >> 0x20),(int)in_stack_ffffffffffffed78);
      gain_condition((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                     (int)(in_stack_ffffffffffffed78 >> 0x20),(int)in_stack_ffffffffffffed78);
      gain_condition((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                     (int)(in_stack_ffffffffffffed78 >> 0x20),(int)in_stack_ffffffffffffed78);
      goto LAB_0063a487;
    }
    in_stack_ffffffffffffed50 = local_8->act[0];
    _Var11 = std::pow<int,int>(0,0x63a33f);
    if ((((in_stack_ffffffffffffed50 & (long)_Var11) != 0) ||
        (local_8->was_in_room != (ROOM_INDEX_DATA *)0x0)) ||
       (local_8->in_room == (ROOM_INDEX_DATA *)0x0)) goto LAB_0063a445;
    local_8->was_in_room = local_8->in_room;
    if (local_8->fighting != (CHAR_DATA *)0x0) {
      stop_fighting((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
                    SUB41((uint)in_stack_ffffffffffffecfc >> 0x18,0));
    }
    act(in_stack_ffffffffffffed10,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
        (void *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
        (void *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),0);
    send_to_char(in_stack_ffffffffffffed10,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
    if (1 < local_8->level) {
      save_char_obj(in_stack_00003588);
    }
    local_8->pause = 0;
    do_quit_new(in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,(bool)in_stack_ffffffffffffee6f)
    ;
  } while( true );
}

Assistant:

void char_update(void)
{
	CHAR_DATA *ch;
	CHAR_DATA *ch_next;
	CHAR_DATA *ch_quit;
	int hgain;
	bool ghost= false;

	ch_quit = nullptr;

	/* update save counter */
	save_number++;

	if (save_number > 2)
		save_number = 0;

	for (ch = char_list; ch != nullptr; ch = ch_next)
	{
		CHAR_DATA *master;
		AFFECT_DATA *paf;
		AFFECT_DATA *paf_next;
		bool charm_gone;

		ch_next = ch->next;
		master = nullptr;

		if (is_npc(ch)
			&& (sun == SolarPosition::Sunrise || sun == SolarPosition::Daylight)
			&& ch->in_room
			&& number_percent() < 90
			&& !is_affected_by(ch, AFF_SLEEP)
			&& ch->fighting == nullptr)
		{
			if (IS_SET(ch->act, ACT_DIURNAL) && is_affected_by(ch, AFF_NOSHOW))
				REMOVE_BIT(ch->affected_by, AFF_NOSHOW);
			else if (IS_SET(ch->act, ACT_NOCTURNAL) && !is_affected_by(ch, AFF_NOSHOW))
				SET_BIT(ch->affected_by, AFF_NOSHOW);
		}
		else if (is_npc(ch) && sun >= SolarPosition::Sunset && ch->in_room && number_percent() < 90 && ch->fighting == nullptr)
		{
			if (IS_SET(ch->act, ACT_NOCTURNAL) && is_affected_by(ch, AFF_NOSHOW))
				REMOVE_BIT(ch->affected_by, AFF_NOSHOW);
			else if (IS_SET(ch->act, ACT_DIURNAL) && !is_affected_by(ch, AFF_NOSHOW))
				SET_BIT(ch->affected_by, AFF_NOSHOW);
		}

		if (ch->pause > 0)
			ch->pause--;

		if (is_npc(ch) && ch->hit < 0 && ch->in_room)
		{
			RS.Logger.Warn("{} in {} has HP {}", ch->name, ch->in_room->vnum, ch->hit);
		}

		if (ch->ghost > 0)
		{
			ch->ghost--;

			switch (ch->ghost)
			{
				case 4:
					send_to_char("Your body starts to collect itself.\n\r", ch);
					break;
				case 2:
					send_to_char("Your body begins to solidify.\n\r", ch);
					break;
				case 0:
					send_to_char("You are no longer a ghost.\n\r", ch);
					break;
			}
		}

		if (ch->bounty_timer > 0)
			ch->bounty_timer--;

		if (ch->ghost > 0)
			ghost = true;

		/* LOWBIE LEVELLING */
		if (!is_npc(ch) && ch->level < 20 && (ch->in_room->vnum > 24599 || ch->in_room->vnum < 24500))
		{
			char buf1[MSL];
			while (ch->level < 20)
			{
				ch->level++;
				advance_level(ch, true);
			}

			ch->exp = exp_per_level(ch) * (ch->level - 1);

			colorconv(buf1, "{RYou feel more experienced as you depart the Adventurer's Academy!{x\n\r", ch);
			send_to_char(buf1, ch);

			colorconv(buf1, "{GYou are now level 20.{x\n\r", ch);
			send_to_char(buf1, ch);

			if (ch->pet)
			{
				sprintf(buf1, "Remember, you can ask your familiar questions.  For example, 'say %s, how do I get to my guild?'.\n\r", ch->pet->short_descr);
				send_to_char(buf1, ch);
			}
		}

		if (!is_npc(ch))
			ch->Profs()->UpdateProfPoints();

		if (!is_affected_by(ch, AFF_SLEEP) && is_affected(ch, gsn_bleeding) && ch->position == POS_SLEEPING)
			ch->position = POS_STANDING;

		if (ch->position >= POS_STUNNED)
		{
			if (ch->hit < ch->max_hit) /* Some regen stuff */
			{
				hgain = hit_gain(ch);
				ch->hit += hgain;
			}
			else
			{
				ch->hit = ch->max_hit;
			}

			if (ch->mana < ch->max_mana)
				ch->mana += mana_gain(ch);
			else
				ch->mana = ch->max_mana;

			if (ch->move < ch->max_move)
				ch->move += (is_affected(ch, gsn_repose)) ? (move_gain(ch) * 2) : (move_gain(ch));
			else
				ch->move = ch->max_move;
		}

		if (ch->position == POS_STUNNED)
			update_pos(ch);

		if (ch->position < POS_STUNNED)
			damage_new(ch, ch, 2, gsn_bleeding, DAM_TRUESTRIKE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "slow bleeding");

		ch->talismanic = std::max((double)0, ch->talismanic - 0.0625);

		if (!is_npc(ch) && ch->in_room)
		{
			ch->pcdata->sect_time[0]++;
			ch->pcdata->sect_time[ch->in_room->sector_type]++;
		}

		if (!is_npc(ch) && ch->pcdata->save_timer)
			ch->pcdata->save_timer--;

		if (!is_npc(ch) /* && !is_immortal(ch) */)
		{
			OBJ_DATA *obj;

			if ((obj = get_eq_char(ch, WEAR_LIGHT)) != nullptr && obj->item_type == ITEM_LIGHT && obj->value[2] > 0)
			{
				if (--obj->value[2] == 0 && ch->in_room != nullptr)
				{
					ch->in_room->light = std::max(0, ch->in_room->light - 3);
					act("$p goes out.", ch, obj, nullptr, TO_ROOM);
					act("$p flickers and goes out.", ch, obj, nullptr, TO_CHAR);
					extract_obj(obj);
				}
				else if (obj->value[2] <= 5 && ch->in_room != nullptr)
				{
					act("$p flickers.", ch, obj, nullptr, TO_CHAR);
				}
			}

			ch->timer++;

			if (ch->timer >= 25 && !is_heroimm(ch) && !is_immortal(ch) && !IS_SET(ch->act, PLR_NOVOID))
			{
				if (ch->was_in_room == nullptr && ch->in_room != nullptr)
				{
					ch->was_in_room = ch->in_room;

					if (ch->fighting != nullptr)
						stop_fighting(ch, true);

					act("$n disappears into the void.", ch, nullptr, nullptr, TO_ROOM);
					send_to_char("You disappear into the void.\n\r", ch);

					if (ch->level > 1)
						save_char_obj(ch);

					ch->pause = 0;
					do_quit_new(ch, "", true);
					continue;
				}
			}

			gain_condition(ch, COND_DRUNK, -1);
			gain_condition(ch, COND_THIRST, 1);
			gain_condition(ch, COND_HUNGER, 1);
		}

		if (!is_npc(ch) && ch->desc == nullptr)
		{
			/* nothing */
		}
		else
		{
			for (paf = ch->affected; paf != nullptr; paf = paf_next)
			{
				paf_next = paf->next;
				charm_gone= false;

				if (!ghost && ch->ghost > 0)
					break;

				if (paf->duration > 0)
				{
					if (paf->tick_fun)
						(*paf->tick_fun)(ch, paf);

					if (!ch || (!ghost && ch->ghost > 0))
						break;

					if (!paf)
						continue;

					paf->duration--;

					if (number_range(0, 4) == 0 && paf->level > 0)
						paf->level--; /* spell strength fades with time */
				}
				else if (paf->duration < 0)
				{
					if (paf->tick_fun)
						(*paf->tick_fun)(ch, paf);

					if (!ghost && ch->ghost > 0)
						break;
				}
				else if (paf->type == gsn_entwine
					&& (paf->owner == nullptr || (paf->owner && ch->in_room != paf->owner->in_room)))
				{
					affect_remove(ch, paf);
				}
				else
				{
					if (((paf->owner && paf->owner->Class()->GetIndex() == CLASS_PALADIN)
							|| (!paf->owner && ch->Class()->GetIndex() == CLASS_PALADIN)
							&& trusts(ch, paf->owner ? paf->owner : ch))
						&& paf->aftype == AFT_COMMUNE)
					{
						if (number_percent() < (get_skill(paf->owner ? paf->owner : ch, gsn_channeling) * .85)
							&& !(skill_table[paf->type].dispel & CAN_CLEANSE))
						{
							check_improve(paf->owner ? paf->owner : ch, gsn_channeling, true, 1);

							if (!paf->owner || ch == paf->owner)
							{
								act("You feel invigorated as your $t supplication is renewed by your deity.", ch, skill_table[paf->type].name, 0, TO_CHAR);
							}
							else
							{
								act("You feel invigorated as $N renews your $t supplication.", ch, skill_table[paf->type].name, paf->owner, TO_CHAR);
							}

							paf->duration = paf->init_duration;
							ch->mana = std::max(ch->mana - skill_table[paf->type].min_mana, 0);
							continue;
						}
					}

					if (paf_next == nullptr || paf_next->type != paf->type || paf_next->duration > 0)
					{
						if (paf->type > 0 && str_cmp(skill_table[paf->type].msg_off, ""))
						{
							send_to_char(skill_table[paf->type].msg_off, ch);
							send_to_char("\n\r", ch);
						}

						if (paf->type && str_cmp(skill_table[paf->type].room_msg_off, "") && is_awake(ch))
							act(skill_table[paf->type].room_msg_off, ch, 0, 0, TO_ROOM);
					}
					affect_remove(ch, paf);
				}
			}
		}

		if (!ch)
			continue;

		if (!ghost && ch->ghost > 0)
			continue;

		/*
		 * Careful with the damages here,
		 *   MUST NOT refer to ch after damage taken,
		 *   as it may be lethal damage (on NPC).
		 *
		 *   You must add a line to the poison check in damage_new in fight.c!
		 */

		if (!is_npc(ch) && ch->in_room && ch->in_room->sector_type == SECT_BURNING)
			damage_new(ch, ch, dice(ch->level / 2, 2), gsn_bleeding, DAM_FIRE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the searing heat*");
	}
	/*
	 * Autosave and autoquit.
	 * Check that these chars still exist.
	 */
	for (ch = char_list; ch != nullptr; ch = ch_next)
	{
		ch_next = ch->next;

		if (ch->desc != nullptr && ch->desc->descriptor % 3 == save_number)
			save_char_obj(ch);
	}
}